

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

void Output::Flush(void)

{
  byte *pbVar1;
  _PAL_FILE *p_Var2;
  PAL_FILE *stream;
  
  pbVar1 = (byte *)__tls_get_addr(&PTR_01e57e60);
  if ((*pbVar1 & 1) == 0) {
    p_Var2 = BasePtr::operator_cast_to__PAL_FILE_((BasePtr *)&s_outputFile);
    if (p_Var2 != (_PAL_FILE *)0x0) {
      stream = (PAL_FILE *)BasePtr::operator_cast_to__PAL_FILE_((BasePtr *)&s_outputFile);
      PAL_fflush(stream);
    }
    PAL__flushall();
  }
  return;
}

Assistant:

void Output::Flush()
{
    if (s_capture)
    {
        return;
    }
#ifdef _WIN32
    if (bufferFreeSize != bufferAllocSize)
    {
        DirectPrint(Output::buffer);
        bufferFreeSize = bufferAllocSize;
    }
#endif
    if(s_outputFile != nullptr)
    {
        fflush(s_outputFile);
    }
    _flushall();
}